

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkElement.cpp
# Opt level: O2

void __thiscall
iDynTree::LinkElement::childHasBeenParsed(LinkElement *this,shared_ptr<iDynTree::XMLElement> *child)

{
  bool bVar1;
  VisualInfo *__x;
  long lVar2;
  shared_ptr<iDynTree::VisualElement> visualElement;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  iDynTree::XMLElement::name_abi_cxx11_();
  bVar1 = std::operator==(&local_48,"visual");
  std::__cxx11::string::~string((string *)&local_48);
  lVar2 = 0xa8;
  if (!bVar1) {
    iDynTree::XMLElement::name_abi_cxx11_();
    bVar1 = std::operator==(&local_48,"collision");
    std::__cxx11::string::~string((string *)&local_48);
    lVar2 = 0xc0;
    if (!bVar1) {
      return;
    }
  }
  std::dynamic_pointer_cast<iDynTree::VisualElement,iDynTree::XMLElement>
            ((shared_ptr<iDynTree::XMLElement> *)&local_48);
  if ((VisualElement *)local_48._M_dataplus._M_p == (VisualElement *)0x0) {
    iDynTree::reportError
              ("LinkElement","childHasBeenParsed",
               "Expecting a VisualElement for visual/collision child. Got another element instead.")
    ;
  }
  else {
    __x = VisualElement::visualInfo((VisualElement *)local_48._M_dataplus._M_p);
    std::
    vector<iDynTree::VisualElement::VisualInfo,_std::allocator<iDynTree::VisualElement::VisualInfo>_>
    ::push_back((vector<iDynTree::VisualElement::VisualInfo,_std::allocator<iDynTree::VisualElement::VisualInfo>_>
                 *)(&this->super_XMLElement + lVar2),__x);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_48._M_string_length);
  return;
}

Assistant:

void LinkElement::childHasBeenParsed(std::shared_ptr<iDynTree::XMLElement> child)
    {
        std::vector<VisualElement::VisualInfo>* visualContainer = nullptr;
        if (child->name() == "visual") {
            visualContainer = &m_visuals;
        } else if (child->name() == "collision") {
            visualContainer = &m_collisions;
        } else {
            return;
        }
        std::shared_ptr<VisualElement> visualElement = std::dynamic_pointer_cast<VisualElement>(child);
        if (!visualElement) {
            reportError("LinkElement", "childHasBeenParsed", "Expecting a VisualElement for visual/collision child. Got another element instead.");
            return;
        }
        visualContainer->push_back(visualElement->visualInfo());
    }